

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O0

bool __thiscall
mpt::content<mpt::reference<mpt::metatype>_*>::set_length
          (content<mpt::reference<mpt::metatype>_*> *this,long len)

{
  byte bVar1;
  ulong uVar2;
  long lVar3;
  uint8_t *ptr;
  size_t set;
  long len_local;
  content<mpt::reference<mpt::metatype>_*> *this_local;
  
  uVar2 = len << 3;
  if (uVar2 == (this->super_buffer)._used) {
    this_local._7_1_ = true;
  }
  else if (uVar2 < (this->super_buffer)._used) {
    bVar1 = mpt::buffer::trim((ulong)this);
    this_local._7_1_ = (bool)(bVar1 & 1);
  }
  else {
    lVar3 = mpt::buffer::insert((ulong)this,uVar2);
    this_local._7_1_ = lVar3 != 0;
  }
  return this_local._7_1_;
}

Assistant:

bool set_length(long len)
	{
		size_t set = len * sizeof(T);
		if (set == _used) {
			return true;
		}
		if (set < _used) {
			return buffer::trim(_used - set);
		}
		/* data before offset gets initialized */
		uint8_t *ptr = static_cast<uint8_t *>(buffer::insert(set, 0));
		return ptr ? true : false;
	}